

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerFlight::EndEffect(APowerFlight *this)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  double dVar4;
  Self local_1c;
  Self local_18;
  TFlags<ActorFlag7,_unsigned_int> local_14;
  APowerFlight *local_10;
  APowerFlight *this_local;
  
  local_10 = this;
  APowerup::EndEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator==(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if ((!bVar1) &&
     (pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
     pAVar3->player != (player_t *)0x0)) {
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag7,_unsigned_int>::operator&
              (&local_14,
               (int)pAVar3 + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14);
    if (uVar2 == 0) {
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      dVar4 = AActor::Z(pAVar3);
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      if ((dVar4 != pAVar3->floorz) || (NAN(dVar4) || NAN(pAVar3->floorz))) {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        pAVar3->player->centering = true;
      }
      operator~((EnumType)&local_18);
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar3->flags2,&local_18);
      operator~((EnumType)&local_1c);
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      TFlags<ActorFlag,_unsigned_int>::operator&=(&pAVar3->flags,&local_1c);
    }
  }
  return;
}

Assistant:

void APowerFlight::EndEffect ()
{
	Super::EndEffect();
	if (Owner == NULL || Owner->player == NULL)
	{
		return;
	}

	if (!(Owner->flags7 & MF7_FLYCHEAT))
	{
		if (Owner->Z() != Owner->floorz)
		{
			Owner->player->centering = true;
		}
		Owner->flags2 &= ~MF2_FLY;
		Owner->flags &= ~MF_NOGRAVITY;
	}
//	BorderTopRefresh = screen->GetPageCount (); //make sure the sprite's cleared out
}